

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O2

ndarray __thiscall SpikesConsumer_python::create_numpy_array(SpikesConsumer_python *this)

{
  PyObject *pPVar1;
  long in_RSI;
  list l;
  object_base local_40;
  object_base local_38;
  object_base local_30;
  object_base local_28;
  object_base local_20;
  int local_14;
  
  boost::python::detail::list_base::list_base((list_base *)&local_38);
  boost::python::make_tuple<char[9],char[3]>
            ((python *)&local_40,(char (*) [9])"ntrodeid",(char (*) [3])"i4");
  boost::python::list::append<boost::python::tuple>((list *)&local_38,(tuple *)&local_40);
  boost::python::api::object_base::~object_base(&local_40);
  boost::python::make_tuple<char[8],char[3]>
            ((python *)&local_40,(char (*) [8])"cluster",(char (*) [3])"i4");
  boost::python::list::append<boost::python::tuple>((list *)&local_38,(tuple *)&local_40);
  boost::python::api::object_base::~object_base(&local_40);
  boost::python::make_tuple<char[10],char[3]>
            ((python *)&local_40,(char (*) [10])0x3a4fc2,(char (*) [3])"u4");
  boost::python::list::append<boost::python::tuple>((list *)&local_38,(tuple *)&local_40);
  boost::python::api::object_base::~object_base(&local_40);
  boost::python::make_tuple<char[9],char[4],int>
            ((python *)&local_40,(char (*) [9])"waveform",(char (*) [4])"2i2",
             (int *)(in_RSI + 0x408));
  boost::python::list::append<boost::python::tuple>((list *)&local_38,(tuple *)&local_40);
  boost::python::api::object_base::~object_base(&local_40);
  local_14 = 1;
  boost::python::make_tuple<int>((python *)&local_28,&local_14);
  (local_38.m_ptr)->ob_refcnt = (local_38.m_ptr)->ob_refcnt + 1;
  local_20.m_ptr = local_38.m_ptr;
  boost::python::numpy::dtype::dtype<boost::python::list>
            ((dtype *)&local_30,(list *)&local_20,false);
  boost::python::numpy::zeros((numpy *)&local_40,(tuple *)&local_28,(dtype *)&local_30);
  boost::python::api::object_base::operator=((object_base *)(in_RSI + 0x430),&local_40);
  boost::python::api::object_base::~object_base(&local_40);
  boost::python::api::object_base::~object_base(&local_30);
  boost::python::api::object_base::~object_base(&local_20);
  boost::python::api::object_base::~object_base(&local_28);
  pPVar1 = ((object_base *)(in_RSI + 0x430))->m_ptr;
  pPVar1->ob_refcnt = (Py_ssize_t)((_func_int *)pPVar1->ob_refcnt + 1);
  (this->super_SpikesConsumer).super_HFSubConsumer.super_HighFreqSub._vptr_HighFreqSub =
       (_func_int **)pPVar1;
  boost::python::api::object_base::~object_base(&local_38);
  return (object)(object)this;
}

Assistant:

np::ndarray create_numpy_array(){
        //x = np.zeros(1, dtype='int32, int32, uint32, npint16')
        list l;
        l.append(boost::python::make_tuple("ntrodeid", "i4"));
        l.append(boost::python::make_tuple("cluster", "i4"));
        l.append(boost::python::make_tuple("timestamp", "u4"));
        l.append(boost::python::make_tuple("waveform", "2i2",maxpoints));
        spikearray = np::zeros(boost::python::make_tuple(1), np::dtype(l));
        return spikearray;
    }